

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O0

Result __thiscall wabt::TypeChecker::OnSimdShuffleOp(TypeChecker *this,Opcode opcode,v128 lane_idx)

{
  Result RVar1;
  int local_3c;
  undefined8 uStack_38;
  int i;
  uint8_t simd_data [16];
  TypeChecker *this_local;
  v128 lane_idx_local;
  Opcode opcode_local;
  Result result;
  
  lane_idx_local.v._0_8_ = lane_idx.v._8_8_;
  simd_data._8_8_ = this;
  lane_idx_local.v[2] = opcode.enum_;
  Result::Result((Result *)(lane_idx_local.v + 3),Error);
  uStack_38 = lane_idx.v._0_8_;
  simd_data._0_8_ = lane_idx_local.v._0_8_;
  for (local_3c = 0; local_3c < 0x10; local_3c = local_3c + 1) {
    if (0x1f < *(byte *)((long)(&lane_idx_local)[-2].v + (long)local_3c)) {
      PrintError(this,"lane index must be less than 32 (got %d)",
                 (ulong)*(byte *)((long)(&lane_idx_local)[-2].v + (long)local_3c));
    }
  }
  RVar1 = CheckOpcode2(this,(Opcode)lane_idx_local.v[2]);
  return (Result)RVar1.enum_;
}

Assistant:

Result TypeChecker::OnSimdShuffleOp(Opcode opcode, v128 lane_idx) {
  Result result = Result::Error;
  uint8_t simd_data[16];
  memcpy(simd_data, &lane_idx, 16);
  for (int i = 0; i < 16; i++) {
    if (simd_data[i] >= 32) {
      PrintError("lane index must be less than 32 (got %d)", simd_data[i]);
    }
  }

  result = CheckOpcode2(opcode);
  return result;
}